

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

void __thiscall dlib::thread_pool_implementation::shutdown_pool(thread_pool_implementation *this)

{
  pointer ptVar1;
  size_t sVar2;
  uint64 *puVar3;
  pointer ptVar4;
  task_state_type *task;
  task_state_type *this_00;
  thread *t;
  pointer ptVar5;
  long lVar6;
  bool bVar7;
  auto_mutex M;
  auto_mutex local_38;
  
  local_38.m = &this->m;
  local_38.r = (rmutex *)0x0;
  local_38.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_38.m);
  do {
    sVar2 = (this->tasks).array_size;
    if (sVar2 == 0) {
      bVar7 = false;
    }
    else {
      puVar3 = &((this->tasks).array_elements)->task_id;
      do {
        sVar2 = sVar2 - 1;
        bVar7 = *puVar3 != 0;
        if (bVar7) break;
        puVar3 = puVar3 + 0x34;
      } while (sVar2 != 0);
    }
    if ((!bVar7) ||
       (pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                          (pthread_mutex_t *)(this->task_done_signaler).associated_mutex), !bVar7))
    {
      this->we_are_destructing = true;
      pthread_cond_broadcast((pthread_cond_t *)&(this->task_ready_signaler).cond);
      auto_mutex::unlock(&local_38);
      ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (ptVar5 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_start; ptVar5 != ptVar1; ptVar5 = ptVar5 + 1)
      {
        std::thread::join();
      }
      ptVar5 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_start;
      ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish;
      ptVar4 = ptVar5;
      if (ptVar1 != ptVar5) {
        do {
          if ((ptVar4->_M_id)._M_thread != 0) {
            std::terminate();
          }
          ptVar4 = ptVar4 + 1;
        } while (ptVar4 != ptVar1);
        (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar5;
      }
      sVar2 = (this->tasks).array_size;
      if (sVar2 != 0) {
        this_00 = (this->tasks).array_elements;
        lVar6 = sVar2 * 0x1a0;
        do {
          task_state_type::propagate_exception(this_00);
          this_00 = this_00 + 1;
          lVar6 = lVar6 + -0x1a0;
        } while (lVar6 != 0);
      }
      return;
    }
  } while( true );
}

Assistant:

void thread_pool_implementation::
    shutdown_pool (
    )
    {
        {
            auto_mutex M(m);
            
            // first wait for all pending tasks to finish
            bool found_task = true;
            while (found_task)
            {
                found_task = false;
                for (unsigned long i = 0; i < tasks.size(); ++i)
                {
                    // If task bucket i has a task that is currently supposed to be processed
                    if (tasks[i].is_empty() == false)
                    {
                        found_task = true;
                        break;
                    }
                }

                if (found_task)
                    task_done_signaler.wait();
            }

            // now tell the threads to kill themselves
            we_are_destructing = true;
            task_ready_signaler.broadcast();
        }

        // wait for all threads to terminate
        for (auto& t : threads)
            t.join();
        threads.clear();

        // Throw any unhandled exceptions.  Since shutdown_pool() is only called in the
        // destructor this will kill the program.
        for (auto&& task : tasks)
            task.propagate_exception();
    }